

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationEnd
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  reference ppTVar1;
  size_type local_28;
  size_t i;
  int iteration_local;
  UnitTest *unit_test_local;
  TestEventRepeater *this_local;
  
  if ((this->forwarding_enabled_ & 1U) != 0) {
    for (local_28 = std::
                    vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                    ::size(&this->listeners_); local_28 != 0; local_28 = local_28 - 1) {
      ppTVar1 = std::
                vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ::operator[](&this->listeners_,local_28 - 1);
      (*(*ppTVar1)->_vptr_TestEventListener[0xf])(*ppTVar1,unit_test,(ulong)(uint)iteration);
    }
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationEnd(const UnitTest& unit_test,
                                           int iteration) {
  if (forwarding_enabled_) {
    for (size_t i = listeners_.size(); i > 0; i--) {
      listeners_[i - 1]->OnTestIterationEnd(unit_test, iteration);
    }
  }
}